

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void destStoreMonoLsb(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  lVar11 = (long)y * rasterBuffer->bytes_per_line;
  puVar3 = rasterBuffer->m_buffer;
  if (rasterBuffer->monoDestinationWithClut == false) {
    if (0 < length) {
      uVar10 = 0;
      do {
        uVar7 = x + (int)uVar10;
        uVar1 = buffer[uVar10];
        bVar4 = (byte)(1 << ((byte)uVar7 & 7));
        if ((int)((uVar1 & 0xff) * 5 + (uVar1 >> 4 & 0xff0) + (uVar1 >> 0x10 & 0xff) * 0xb >> 5) <
            *(int *)((long)qt_bayer_matrix[0] + (ulong)(uVar7 & 0xf) * 4 + (ulong)((y & 0xfU) << 6))
           ) {
          bVar4 = puVar3[((int)uVar7 >> 3) + lVar11] | bVar4;
        }
        else {
          bVar4 = puVar3[((int)uVar7 >> 3) + lVar11] & ~bVar4;
        }
        puVar3[((int)uVar7 >> 3) + lVar11] = bVar4;
        uVar10 = uVar10 + 1;
      } while ((uint)length != uVar10);
    }
  }
  else if (0 < length) {
    uVar10 = 0;
    do {
      uVar1 = buffer[uVar10];
      uVar7 = rasterBuffer->destColor0;
      iVar15 = (int)((uint)x + uVar10) >> 3;
      bVar4 = (byte)((uint)x + uVar10);
      if (uVar1 == uVar7) {
        puVar3[iVar15 + lVar11] = puVar3[iVar15 + lVar11] & ~(byte)(1 << (bVar4 & 7));
      }
      else {
        uVar2 = rasterBuffer->destColor1;
        bVar4 = bVar4 & 7;
        if (uVar1 == uVar2) {
          puVar3[iVar15 + lVar11] = puVar3[iVar15 + lVar11] | (byte)(1 << bVar4);
        }
        else {
          bVar4 = (byte)(1 << bVar4);
          if ((uVar2 == uVar7) ||
             (uVar5 = uVar1 >> 0x10 & 0xff, uVar8 = uVar1 >> 8 & 0xff,
             iVar16 = uVar5 - (uVar7 >> 0x10 & 0xff), iVar14 = uVar8 - (uVar7 >> 8 & 0xff),
             iVar12 = (uVar1 & 0xff) - (uVar7 & 0xff), iVar6 = uVar5 - (uVar2 >> 0x10 & 0xff),
             iVar9 = uVar8 - (uVar2 >> 8 & 0xff), iVar13 = (uVar1 & 0xff) - (uVar2 & 0xff),
             (uint)(iVar12 * iVar12 + iVar14 * iVar14 + iVar16 * iVar16) <
             (uint)(iVar13 * iVar13 + iVar9 * iVar9 + iVar6 * iVar6))) {
            bVar4 = puVar3[iVar15 + lVar11] & ~bVar4;
          }
          else {
            bVar4 = puVar3[iVar15 + lVar11] | bVar4;
          }
          puVar3[iVar15 + lVar11] = bVar4;
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uint)length != uVar10);
  }
  return;
}

Assistant:

static void QT_FASTCALL destStoreMonoLsb(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *Q_DECL_RESTRICT data = (uchar *)rasterBuffer->scanLine(y);
    if (rasterBuffer->monoDestinationWithClut) {
        for (int i = 0; i < length; ++i) {
            if (buffer[i] == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else if (buffer[i] == rasterBuffer->destColor1) {
                data[x >> 3] |= 1 << (x & 7);
            } else if (findNearestColor(buffer[i], rasterBuffer) == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else {
                data[x >> 3] |= 1 << (x & 7);
            }
            ++x;
        }
    } else {
        for (int i = 0; i < length; ++i) {
            if (qGray(buffer[i]) < int(qt_bayer_matrix[y & 15][x & 15]))
                data[x >> 3] |= 1 << (x & 7);
            else
                data[x >> 3] &= ~(1 << (x & 7));
            ++x;
        }
    }
}